

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::UnicodeSet::applyFilter
          (UnicodeSet *this,Filter filter,void *context,UnicodeSet *inclusions,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UChar32 UVar3;
  UChar32 UVar4;
  int start;
  int end;
  int iVar5;
  int32_t index;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    clear(this);
    iVar2 = getRangeCount(inclusions);
    if (iVar2 < 1) {
      start = -1;
    }
    else {
      index = 0;
      start = -1;
      do {
        UVar3 = getRangeStart(inclusions,index);
        UVar4 = getRangeEnd(inclusions,index);
        if (UVar3 <= UVar4) {
          end = UVar3 + -1;
          do {
            iVar5 = end + 1;
            UVar1 = (*filter)(iVar5,context);
            if (UVar1 == '\0') {
              if (-1 < start) {
                add(this,start,end);
                start = -1;
              }
            }
            else if (start < 0) {
              start = iVar5;
            }
            end = iVar5;
          } while (UVar4 != iVar5);
        }
        index = index + 1;
      } while (index != iVar2);
    }
    if (-1 < start) {
      add(this,start,0x10ffff);
    }
    if (((this->fFlags & 1) != 0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }